

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arch_specific.cc
# Opt level: O0

double highwayhash::anon_unknown_4::DetectNominalClockRate(void)

{
  long lVar1;
  double dVar2;
  undefined1 local_b0 [8];
  string digits;
  size_t pos_space;
  size_t pos_prefix;
  size_t i;
  double multipliers [3];
  char *local_58;
  char *prefixes [3];
  string local_38 [32];
  string *local_18;
  string *brand_string;
  
  (anonymous_namespace)::BrandString_abi_cxx11_();
  local_18 = local_38;
  prefixes[0] = "GHz";
  prefixes[1] = "THz";
  multipliers[0] = 1000000000.0;
  multipliers[1] = 1000000000000.0;
  pos_prefix = 0;
  do {
    if (2 < pos_prefix) {
      brand_string = (string *)0x0;
LAB_0011d48e:
      std::__cxx11::string::~string(local_38);
      return (double)brand_string;
    }
    lVar1 = std::__cxx11::string::find((char *)local_18,(ulong)prefixes[pos_prefix - 1]);
    if ((lVar1 != -1) &&
       (digits.field_2._8_8_ = std::__cxx11::string::rfind((char)local_18,0x20),
       digits.field_2._8_8_ != -1)) {
      std::__cxx11::string::substr((ulong)local_b0,(ulong)local_18);
      dVar2 = std::__cxx11::stod((string *)local_b0,(size_t *)0x0);
      brand_string = (string *)(dVar2 * multipliers[pos_prefix - 1]);
      std::__cxx11::string::~string((string *)local_b0);
      goto LAB_0011d48e;
    }
    pos_prefix = pos_prefix + 1;
  } while( true );
}

Assistant:

double DetectNominalClockRate() {
#if HH_ARCH_X64
  const std::string& brand_string = BrandString();
  // Brand strings include the maximum configured frequency. These prefixes are
  // defined by Intel CPUID documentation.
  const char* prefixes[3] = {"MHz", "GHz", "THz"};
  const double multipliers[3] = {1E6, 1E9, 1E12};
  for (size_t i = 0; i < 3; ++i) {
    const size_t pos_prefix = brand_string.find(prefixes[i]);
    if (pos_prefix != std::string::npos) {
      const size_t pos_space = brand_string.rfind(' ', pos_prefix - 1);
      if (pos_space != std::string::npos) {
        const std::string digits =
            brand_string.substr(pos_space + 1, pos_prefix - pos_space - 1);
        return std::stod(digits) * multipliers[i];
      }
    }
  }
#elif HH_ARCH_PPC
  double freq = -1;
#if __linux__
  char line[200];
  char* s;
  char* value;

  FILE* f = fopen("/proc/cpuinfo", "r");
  if (f != nullptr) {
    while (fgets(line, sizeof(line), f) != nullptr) {
      // NOTE: the ':' is the only character we can rely on
      if (!(value = strchr(line, ':'))) continue;
      // terminate the valuename
      *value++ = '\0';
      // skip any leading spaces
      while (*value == ' ') value++;
      if ((s = strchr(value, '\n'))) *s = '\0';

      if (!strncasecmp(line, "clock", strlen("clock")) &&
          sscanf(value, "%lf", &freq) == 1) {
        freq *= 1E6;
        break;
      }
    }
    fclose(f);
    return freq;
  }
#elif __FreeBSD__
  size_t length = sizeof(freq);
  sysctlbyname("dev.cpu.0.freq", &freq, &length, NULL, 0);
  freq *= 1E6;
  return freq;
#endif
#endif

  return 0.0;
}